

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

w_status w_logger_deregister(w_logger logger_handle)

{
  int iVar1;
  w_status wVar2;
  w_status wVar3;
  ulong uVar4;
  
  iVar1 = w_mtx_lock(&wp_log_mtx);
  if (iVar1 == 0) {
    uVar4 = (ulong)logger_handle.handle & 0xffff;
    if (7 < (uint)uVar4) {
      w_handle_failed_assertion
                ("WP_LOG_GET_HANDLE_IDX(handle) < W_GET_ARRAY_LEN(wp_log_logger_pool)",
                 "wp_log_logger_find",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
                 ,0x6f);
    }
    wVar3 = W_ERROR_NOT_FOUND;
    if ((wp_log_logger_pool[uVar4].valid != 0) &&
       (logger_handle.handle >> 0x10 == (uint)wp_log_logger_pool[uVar4].id)) {
      wp_log_logger_pool[uVar4].valid = 0;
      wVar3 = W_SUCCESS;
    }
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    wVar2 = W_ERROR_UNLOCK_FAILED;
    if (iVar1 == 0) {
      wVar2 = wVar3;
    }
  }
  else {
    wVar2 = W_ERROR_LOCK_FAILED;
  }
  return wVar2;
}

Assistant:

enum w_status
w_logger_deregister(
    struct w_logger logger_handle
)
{
    enum w_status status;
    struct wp_log_logger *logger;

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    status = wp_log_logger_find(&logger, logger_handle.handle);
    if (status == W_SUCCESS)
    {
        logger->valid = 0;
    }

    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}